

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap4.c
# Opt level: O1

void ftl2c_(int *A1,char *A2,int *A3,size_t C2)

{
  int lval;
  char *s;
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  char str [21];
  char acStack_48 [32];
  
  lval = *A1;
  sVar3 = gMinStrLen;
  if (gMinStrLen <= C2) {
    sVar3 = C2;
  }
  s = (char *)malloc(sVar3 + 1);
  s[C2] = '\0';
  pcVar2 = A2;
  memcpy(s,A2,C2);
  kill_trailing(s,(char)pcVar2);
  ffl2c(lval,s,A3);
  snprintf(acStack_48,0x15,"%20s",s);
  strcpy(s,acStack_48);
  if (s != (char *)0x0) {
    sVar1 = strlen(s);
    if (C2 <= sVar1) {
      sVar1 = C2;
    }
    memcpy(A2,s,sVar1);
    sVar1 = strlen(s);
    if (sVar1 <= C2 && C2 - sVar1 != 0) {
      memset(A2 + sVar1,0x20,C2 - sVar1);
    }
    free(s);
    return;
  }
  return;
}

Assistant:

CFextern VOID_cfF(FTL2C,ftl2c)
CFARGT14(NCF,DCF,ABSOFT_cf2(VOID),LOGICAL,PSTRING,PINT,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0))
{
   QCF(LOGICAL,1)
   QCF(PSTRING,2)
   QCF(PINT,3)
   char str[21];

   ffl2c( TCF(ftl2c,LOGICAL,1,0) 
          TCF(ftl2c,PSTRING,2,1) 
          TCF(ftl2c,PINT,3,1) );

   snprintf(str,21,"%20s",B2);
   strcpy(B2,str);

   RCF(LOGICAL,1)
   RCF(PSTRING,2)
   RCF(PINT,3)
}